

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentLocals.cpp
# Opt level: O0

void __thiscall wasm::InstrumentLocals::visitLocalGet(InstrumentLocals *this,LocalGet *curr)

{
  char **this_00;
  Index x;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  bool bVar1;
  BasicType BVar2;
  Module *wasm;
  Call *expression;
  bool local_c2;
  bool local_c1;
  allocator<wasm::Expression_*> local_99;
  Const *local_98;
  Const *local_90;
  LocalGet *local_88;
  Const **local_80;
  size_type local_78;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_70;
  size_t local_58;
  char *pcStack_50;
  BasicHeapType local_40 [2];
  HeapType local_38;
  HeapType heapType;
  Name import;
  Builder builder;
  LocalGet *curr_local;
  InstrumentLocals *this_local;
  
  wasm = Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>::getModule
                   (&(this->
                     super_WalkerPass<wasm::PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>_>
                     ).
                     super_PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>
                     .
                     super_Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>
                   );
  Builder::Builder((Builder *)&import.super_IString.str._M_str,wasm);
  wasm::Name::Name((Name *)&heapType);
  bVar1 = wasm::Type::isRef(&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).
                             super_Expression.type);
  if (bVar1) {
    local_38 = wasm::Type::getHeapType
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).
                           super_Expression.type);
    local_40[1] = 1;
    bVar1 = HeapType::operator==(&local_38,local_40 + 1);
    local_c1 = false;
    if (bVar1) {
      local_c1 = wasm::Type::isNullable
                           (&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).
                             super_Expression.type);
    }
    if (local_c1 == false) {
      local_40[0] = ext;
      bVar1 = HeapType::operator==(&local_38,local_40);
      local_c2 = false;
      if (bVar1) {
        local_c2 = wasm::Type::isNullable
                             (&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).
                               super_Expression.type);
      }
      if (local_c2 == false) {
        handle_unreachable("TODO: general reference types",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                           ,0x51);
      }
      wasm::Name::operator=((Name *)&heapType,(Name *)&get_externref);
    }
    else {
      wasm::Name::operator=((Name *)&heapType,(Name *)&get_funcref);
    }
  }
  else {
    bVar1 = wasm::Type::isTuple(&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).
                                 super_Expression.type);
    if (bVar1) {
      __assert_fail("!curr->type.isTuple() && \"Unexpected tuple type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                    ,0x54,"void wasm::InstrumentLocals::visitLocalGet(LocalGet *)");
    }
    bVar1 = wasm::Type::isBasic(&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).
                                 super_Expression.type);
    if (!bVar1) {
      __assert_fail("curr->type.isBasic() && \"TODO: handle compound types\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                    ,0x54,"void wasm::InstrumentLocals::visitLocalGet(LocalGet *)");
    }
    BVar2 = wasm::Type::getBasic
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.
                        type);
    switch(BVar2) {
    case none:
    case unreachable:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                         ,0x66);
    case i32:
      wasm::Name::operator=((Name *)&heapType,(Name *)&get_i32);
      break;
    case i64:
      return;
    case f32:
      wasm::Name::operator=((Name *)&heapType,(Name *)&get_f32);
      break;
    case f64:
      wasm::Name::operator=((Name *)&heapType,(Name *)&get_f64);
      break;
    case v128:
      wasm::Name::operator=((Name *)&heapType,(Name *)&get_v128);
    }
  }
  local_58 = heapType.id;
  pcStack_50 = (char *)import.super_IString.str._M_len;
  x = this->id;
  this->id = x + 1;
  this_00 = &import.super_IString.str._M_str;
  local_98 = Builder::makeConst<int>((Builder *)this_00,x);
  local_90 = Builder::makeConst<int>((Builder *)this_00,curr->index);
  local_80 = &local_98;
  local_78 = 3;
  local_88 = curr;
  std::allocator<wasm::Expression_*>::allocator(&local_99);
  __l._M_len = local_78;
  __l._M_array = (iterator)local_80;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_70,__l,&local_99);
  target.super_IString.str._M_str = pcStack_50;
  target.super_IString.str._M_len = local_58;
  expression = Builder::makeCall((Builder *)&import.super_IString.str._M_str,target,&local_70,
                                 (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)8>).
                                       super_Expression.type.id,false);
  Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>_>
              ).
              super_PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>
              .super_Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>,
             (Expression *)expression);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_70);
  std::allocator<wasm::Expression_*>::~allocator(&local_99);
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
    Builder builder(*getModule());
    Name import;
    if (curr->type.isRef()) {
      auto heapType = curr->type.getHeapType();
      if (heapType == HeapType::func && curr->type.isNullable()) {
        import = get_funcref;
      } else if (heapType == HeapType::ext && curr->type.isNullable()) {
        import = get_externref;
      } else {
        WASM_UNREACHABLE("TODO: general reference types");
      }
    } else {
      TODO_SINGLE_COMPOUND(curr->type);
      switch (curr->type.getBasic()) {
        case Type::i32:
          import = get_i32;
          break;
        case Type::i64:
          return; // TODO
        case Type::f32:
          import = get_f32;
          break;
        case Type::f64:
          import = get_f64;
          break;
        case Type::v128:
          import = get_v128;
          break;
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
    }
    replaceCurrent(builder.makeCall(import,
                                    {builder.makeConst(int32_t(id++)),
                                     builder.makeConst(int32_t(curr->index)),
                                     curr},
                                    curr->type));
  }